

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

_Bool path_append(ecs_world_t *world,ecs_entity_t parent,ecs_entity_t child,ecs_entity_t component,
                 char *sep,char *prefix,ecs_strbuf_t *buf)

{
  ecs_type_t type_00;
  ecs_entity_t child_00;
  char **local_70;
  char *name;
  char buff [22];
  ecs_entity_t cur;
  ecs_type_t type;
  char *prefix_local;
  char *sep_local;
  ecs_entity_t component_local;
  ecs_entity_t child_local;
  ecs_entity_t parent_local;
  ecs_world_t *world_local;
  
  type_00 = ecs_get_type(world,child);
  child_00 = ecs_find_in_type(world,type_00,component,0xfd00000000000000);
  if (child_00 == 0) {
    if (prefix != (char *)0x0) {
      ecs_strbuf_appendstr(buf,prefix);
    }
  }
  else if ((child_00 != parent) && (child_00 != 0x118)) {
    path_append(world,parent,child_00,component,sep,prefix,buf);
    ecs_strbuf_appendstr(buf,sep);
  }
  local_70 = (char **)ecs_get_name(world,child);
  if (local_70 == (char **)0x0) {
    sprintf((char *)&name,"%u",child & 0xffffffff);
    local_70 = &name;
  }
  ecs_strbuf_appendstr(buf,(char *)local_70);
  return child_00 != 0;
}

Assistant:

static
bool path_append(
    ecs_world_t *world, 
    ecs_entity_t parent, 
    ecs_entity_t child, 
    ecs_entity_t component,
    const char *sep,
    const char *prefix,
    ecs_strbuf_t *buf)
{
    ecs_type_t type = ecs_get_type(world, child);
    ecs_entity_t cur = ecs_find_in_type(world, type, component, ECS_CHILDOF);
    
    if (cur) {
        if (cur != parent && cur != EcsFlecsCore) {
            path_append(world, parent, cur, component, sep, prefix, buf);
            ecs_strbuf_appendstr(buf, sep);
        }
    } else if (prefix) {
        ecs_strbuf_appendstr(buf, prefix);
    }

    char buff[22];
    const char *name = ecs_get_name(world, child);
    if (!name) {
        ecs_os_sprintf(buff, "%u", (uint32_t)child);
        name = buff;
    }

    ecs_strbuf_appendstr(buf, name);

    return cur != 0;
}